

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O1

csp_conn_t * csp_conn_find_dport(uint dport)

{
  csp_conn_t *in_RAX;
  long lVar1;
  bool bVar2;
  
  lVar1 = 0;
  while( true ) {
    bVar2 = true;
    if (((byte)arr_conn[0].rx_queue_static_data[lVar1 + -0x22] == dport) &&
       (*(int *)(arr_conn[0].rx_queue_static_data + lVar1 + -0x2c) == 1)) {
      bVar2 = ((csp_conn_t *)(arr_conn[0].rx_queue_static_data + lVar1 + -0x30))->type != 0;
      if (!bVar2) {
        in_RAX = (csp_conn_t *)(arr_conn[0].rx_queue_static_data + lVar1 + -0x30);
      }
    }
    if (!bVar2) break;
    lVar1 = lVar1 + 0x118;
    if (lVar1 == 0x8c0) {
      return (csp_conn_t *)0x0;
    }
  }
  return in_RAX;
}

Assistant:

csp_conn_t * csp_conn_find_dport(unsigned int dport) {

	for (int i = 0; i < CSP_CONN_MAX; i++) {
		csp_conn_t * conn = &arr_conn[i];

		/* Connection must match dport */
		if (conn->idin.dport != dport)
			continue;

		/* Connection must be open */
		if (conn->state != CONN_OPEN)
			continue;

		/* Connection must be client */
		if (conn->type != CONN_CLIENT)
			continue;

		/* All conditions found! */
		return conn;
	}

	return NULL;
}